

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestRunStats::TestRunStats
          (TestRunStats *this,TestRunInfo *_runInfo,Totals *_totals,bool _aborting)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  undefined4 uVar6;
  
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_002e59d0;
  std::__cxx11::string::string((string *)&this->runInfo,(string *)_runInfo);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar5 = _totals->error;
  uVar6 = *(undefined4 *)&_totals->field_0x4;
  sVar1 = (_totals->assertions).passed;
  sVar2 = (_totals->assertions).failed;
  sVar3 = (_totals->assertions).failedButOk;
  sVar4 = (_totals->testCases).failed;
  (this->totals).testCases.passed = (_totals->testCases).passed;
  (this->totals).testCases.failed = sVar4;
  (this->totals).assertions.failed = sVar2;
  (this->totals).assertions.failedButOk = sVar3;
  (this->totals).error = iVar5;
  *(undefined4 *)&(this->totals).field_0x4 = uVar6;
  (this->totals).assertions.passed = sVar1;
  this->aborting = _aborting;
  return;
}

Assistant:

TestRunStats::TestRunStats(   TestRunInfo const& _runInfo,
                    Totals const& _totals,
                    bool _aborting )
    :   runInfo( _runInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}